

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O0

void __thiscall Snes_Spc::reset_buf(Snes_Spc *this)

{
  Spc_Dsp *in_RDI;
  sample_t_conflict1 *out;
  int *local_10;
  
  local_10 = in_RDI[1].m.voices[0].volume + 1;
  while (local_10 < in_RDI[1].m.voices[1].buf + 2) {
    *(undefined2 *)local_10 = 0;
    local_10 = (int *)((long)local_10 + 2);
  }
  *(int **)&in_RDI[1].m.voices[0].hidden_env = local_10;
  in_RDI[1].m.voices[0].brr_offset = 0;
  in_RDI[1].m.voices[0].kon_delay = 0;
  Spc_Dsp::set_output(in_RDI,(sample_t_conflict1 *)0x0,0);
  return;
}

Assistant:

void Snes_Spc::reset_buf()
{
	// Start with half extra buffer of silence
	sample_t* out = m.extra_buf;
	while ( out < &m.extra_buf [extra_size / 2] )
		*out++ = 0;
	
	m.extra_pos = out;
	m.buf_begin = 0;
	
	dsp.set_output( 0, 0 );
}